

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_striped_sse41_128_16.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_stats_striped_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int iVar1;
  int iVar2;
  parasail_matrix_t *ppVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  __m128i *palVar7;
  __m128i *palVar8;
  __m128i *palVar9;
  __m128i *palVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  longlong lVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  longlong lVar16;
  ulong uVar17;
  ulong uVar18;
  longlong lVar19;
  longlong lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  __m128i alVar57;
  short sVar58;
  short sVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  __m128i *ptr;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  int16_t *ptr_00;
  __m128i *palVar63;
  uint uVar64;
  int iVar65;
  int iVar66;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  ushort uVar67;
  short sVar68;
  short sVar69;
  short sVar73;
  short sVar74;
  short sVar76;
  short sVar77;
  ushort uVar78;
  short sVar79;
  short sVar80;
  ulong uVar70;
  ushort uVar72;
  ushort uVar75;
  ushort uVar81;
  short sVar82;
  short sVar83;
  ushort uVar85;
  ushort uVar88;
  undefined1 auVar71 [16];
  short sVar86;
  short sVar87;
  short sVar89;
  short sVar90;
  ushort uVar91;
  short sVar92;
  short sVar93;
  ulong uVar84;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  __m128i alVar100;
  __m128i alVar101;
  __m128i alVar102;
  __m128i alVar103;
  __m128i alVar104;
  __m128i alVar105;
  ulong local_12b0;
  int local_12a4;
  int local_1294;
  long local_1290;
  long local_1288;
  int local_127c;
  ulong uStack_1268;
  __m128i vHL_1;
  __m128i vHS_1;
  __m128i vHM_1;
  __m128i vH_1;
  int32_t temp;
  int32_t column_len;
  int16_t *l;
  int16_t *s;
  int16_t *m;
  int16_t *t;
  __m128i cond_max;
  __m128i cond;
  __m128i case2_1;
  __m128i case1_1;
  int16_t tmp2;
  int64_t tmp_6;
  __m128i vHp;
  __m128i case2;
  __m128i case1;
  __m128i *tmp_5;
  __m128i *tmp_4;
  __m128i *tmp_3;
  __m128i *tmp_2;
  __m128i *vPS;
  __m128i *vPM;
  __m128i *vP;
  __m128i vHL;
  __m128i vHS;
  __m128i vHM;
  __m128i vH_dag;
  __m128i vH;
  __m128i vFL;
  __m128i vFS;
  __m128i vFM;
  __m128i vF_ext;
  __m128i vF;
  __m128i vEL;
  __m128i vES;
  __m128i vEM;
  __m128i vE_ext;
  __m128i vE;
  __m128i vEF_opn;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_16_t e;
  __m128i_16_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m128i vPosMask;
  __m128i vMaxHL;
  __m128i vMaxHS;
  __m128i vMaxHM;
  __m128i vMaxH;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  short local_f60;
  int16_t local_f5e;
  int16_t local_f5c;
  short local_f5a;
  int16_t length;
  int16_t similar;
  int16_t matches;
  int16_t score;
  __m128i vOne;
  __m128i vZero;
  int16_t POS_LIMIT;
  int16_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int16_t *boundary;
  __m128i *pvEL;
  __m128i *pvES;
  __m128i *pvEM;
  __m128i *pvE;
  __m128i *pvHLLoad;
  __m128i *pvHLStore;
  __m128i *pvHSLoad;
  __m128i *pvHSStore;
  __m128i *pvHMLoad;
  __m128i *pvHMStore;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i *vProfileS;
  __m128i *vProfileM;
  __m128i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int s1_beg_local;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  ushort local_dc8;
  ushort uStack_dc6;
  ushort uStack_dc4;
  ushort uStack_dc2;
  ushort uStack_dc0;
  ushort uStack_dbe;
  ushort uStack_dbc;
  ushort uStack_dba;
  short local_858;
  short sStack_856;
  short sStack_854;
  short sStack_852;
  short sStack_850;
  short sStack_84e;
  short sStack_84c;
  short sStack_84a;
  short local_838;
  short sStack_836;
  short sStack_834;
  short sStack_832;
  short sStack_830;
  short sStack_82e;
  short sStack_82c;
  short sStack_82a;
  short local_818;
  short sStack_816;
  short sStack_814;
  short sStack_812;
  short sStack_810;
  short sStack_80e;
  short sStack_80c;
  short sStack_80a;
  short local_7e8;
  short sStack_7e6;
  short sStack_7e4;
  short sStack_7e2;
  short sStack_7e0;
  short sStack_7de;
  short sStack_7dc;
  short sStack_7da;
  ushort local_7d8;
  ushort uStack_7d6;
  ushort uStack_7d4;
  ushort uStack_7d2;
  ushort uStack_7d0;
  ushort uStack_7ce;
  ushort uStack_7cc;
  ushort uStack_7ca;
  short local_7c8;
  short sStack_7c6;
  short sStack_7c4;
  short sStack_7c2;
  short sStack_7c0;
  short sStack_7be;
  short sStack_7bc;
  short sStack_7ba;
  short local_7b8;
  short sStack_7b6;
  short sStack_7b4;
  short sStack_7b2;
  short sStack_7b0;
  short sStack_7ae;
  short sStack_7ac;
  short sStack_7aa;
  short local_798;
  short sStack_796;
  short sStack_794;
  short sStack_792;
  short sStack_790;
  short sStack_78e;
  short sStack_78c;
  short sStack_78a;
  short local_788;
  short sStack_786;
  short sStack_784;
  short sStack_782;
  short sStack_780;
  short sStack_77e;
  short sStack_77c;
  short sStack_77a;
  short local_778;
  short sStack_776;
  short sStack_774;
  short sStack_772;
  short sStack_770;
  short sStack_76e;
  short sStack_76c;
  short sStack_76a;
  short local_758;
  short sStack_756;
  short sStack_754;
  short sStack_752;
  short sStack_750;
  short sStack_74e;
  short sStack_74c;
  short sStack_74a;
  short local_738;
  short sStack_736;
  short sStack_734;
  short sStack_732;
  short sStack_730;
  short sStack_72e;
  short sStack_72c;
  short sStack_72a;
  short local_708;
  short sStack_706;
  short sStack_704;
  short sStack_702;
  short sStack_700;
  short sStack_6fe;
  short sStack_6fc;
  short sStack_6fa;
  ushort local_6f8;
  ushort uStack_6f6;
  ushort uStack_6f4;
  ushort uStack_6f2;
  ushort uStack_6f0;
  ushort uStack_6ee;
  ushort uStack_6ec;
  ushort uStack_6ea;
  short local_6d8;
  short sStack_6d6;
  short sStack_6d4;
  short sStack_6d2;
  short sStack_6d0;
  short sStack_6ce;
  short sStack_6cc;
  short sStack_6ca;
  ushort local_6c8;
  ushort uStack_6c6;
  ushort uStack_6c4;
  ushort uStack_6c2;
  ushort uStack_6c0;
  ushort uStack_6be;
  ushort uStack_6bc;
  ushort uStack_6ba;
  short local_288;
  short sStack_286;
  short sStack_284;
  short sStack_282;
  short sStack_280;
  short sStack_27e;
  short sStack_27c;
  short sStack_27a;
  short local_268;
  short sStack_266;
  short sStack_264;
  short sStack_262;
  short sStack_260;
  short sStack_25e;
  short sStack_25c;
  short sStack_25a;
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  short sStack_1a0;
  short sStack_19e;
  short sStack_19c;
  short sStack_19a;
  short local_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_190;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  short local_188;
  short sStack_186;
  short sStack_184;
  short sStack_182;
  short sStack_180;
  short sStack_17e;
  short sStack_17c;
  short sStack_17a;
  short local_158;
  short sStack_156;
  short sStack_154;
  short sStack_152;
  short sStack_150;
  short sStack_14e;
  short sStack_14c;
  short sStack_14a;
  short local_148;
  short sStack_146;
  short sStack_144;
  short sStack_142;
  short sStack_140;
  short sStack_13e;
  short sStack_13c;
  short sStack_13a;
  ulong uStack_50;
  short local_28;
  short sStack_26;
  short sStack_24;
  short sStack_22;
  short sStack_20;
  short sStack_1e;
  short sStack_1c;
  short sStack_1a;
  size_t len;
  
  _segNum = (parasail_profile_t *)0x0;
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_striped_profile_sse41_128_16",
            "profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile16).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_striped_profile_sse41_128_16",
            "profile->profile16.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_striped_profile_sse41_128_16",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_stats_striped_profile_sse41_128_16",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_striped_profile_sse41_128_16","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_stats_striped_profile_sse41_128_16",
            "s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_stats_striped_profile_sse41_128_16",
            "open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_stats_striped_profile_sse41_128_16",
            "gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    matrix._0_4_ = s2Len + -1;
    ppVar3 = profile->matrix;
    iVar60 = (iVar1 + 7) / 8;
    iVar66 = (iVar1 + -1) % iVar60;
    iVar61 = ~((iVar1 + -1) / iVar60) + 8;
    pvVar4 = (profile->profile16).score;
    pvVar5 = (profile->profile16).matches;
    pvVar6 = (profile->profile16).similar;
    s1_beg_local._0_2_ = (short)open;
    uVar11 = CONCAT26((short)s1_beg_local,
                      CONCAT24((short)s1_beg_local,CONCAT22((short)s1_beg_local,(short)s1_beg_local)
                              ));
    uVar14 = CONCAT26((short)s1_beg_local,
                      CONCAT24((short)s1_beg_local,CONCAT22((short)s1_beg_local,(short)s1_beg_local)
                              ));
    i._0_2_ = (undefined2)gap;
    uVar12 = CONCAT26((undefined2)i,CONCAT24((undefined2)i,CONCAT22((undefined2)i,(undefined2)i)));
    uVar15 = CONCAT26((undefined2)i,CONCAT24((undefined2)i,CONCAT22((undefined2)i,(undefined2)i)));
    if (ppVar3->min <= -open) {
      s1_beg_local._0_2_ = -(short)ppVar3->min;
    }
    sVar58 = (short)s1_beg_local + -0x7fff;
    sVar59 = ((ushort)ppVar3->max ^ 0x7fff) - 1;
    local_f5c = 0;
    local_f5e = 0;
    local_f60 = 0;
    lVar13 = CONCAT26(sVar58,CONCAT24(sVar58,CONCAT22(sVar58,sVar58)));
    lVar16 = CONCAT26(sVar58,CONCAT24(sVar58,CONCAT22(sVar58,sVar58)));
    vSaturationCheckMax[1] = CONCAT26(sVar59,CONCAT24(sVar59,CONCAT22(sVar59,sVar59)));
    vSaturationCheckMin[0] = CONCAT26(sVar59,CONCAT24(sVar59,CONCAT22(sVar59,sVar59)));
    vMaxH[0] = lVar16;
    vMaxHM[1] = lVar13;
    vMaxHM[0] = lVar16;
    vMaxHS[1] = lVar13;
    vMaxHS[0] = lVar16;
    vMaxHL[1] = lVar13;
    vMaxHL[0] = lVar16;
    vPosMask[1] = lVar13;
    vProfile._0_2_ = (short)iVar61;
    result._0_2_ = -(ushort)((short)vProfile == 7);
    result._2_2_ = -(ushort)((short)vProfile == 6);
    result._4_2_ = -(ushort)((short)vProfile == 5);
    result._6_2_ = -(ushort)((short)vProfile == 4);
    vPosMask[0]._0_2_ = -(ushort)((short)vProfile == 3);
    vPosMask[0]._2_2_ = -(ushort)((short)vProfile == 2);
    vPosMask[0]._4_2_ = -(ushort)((short)vProfile == 1);
    vPosMask[0]._6_2_ = -(ushort)((short)vProfile == 0);
    _segNum = (parasail_profile_t *)parasail_result_new_stats();
    if (_segNum == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x8210802;
      uVar64 = 0;
      if (s1_beg != 0) {
        uVar64 = 8;
      }
      *(uint *)&_segNum->field_0xc = uVar64 | *(uint *)&_segNum->field_0xc;
      uVar64 = 0;
      if (s1_end != 0) {
        uVar64 = 0x10;
      }
      *(uint *)&_segNum->field_0xc = uVar64 | *(uint *)&_segNum->field_0xc;
      uVar64 = 0;
      if (s2_beg != 0) {
        uVar64 = 0x4000;
      }
      *(uint *)&_segNum->field_0xc = uVar64 | *(uint *)&_segNum->field_0xc;
      uVar64 = 0;
      if (s2_end != 0) {
        uVar64 = 0x8000;
      }
      uVar64 = uVar64 | *(uint *)&_segNum->field_0xc;
      len = (size_t)uVar64;
      *(uint *)&_segNum->field_0xc = uVar64;
      pvHLoad = parasail_memalign___m128i(0x10,(long)iVar60);
      pvHMStore = parasail_memalign___m128i(0x10,(long)iVar60);
      pvHMLoad = parasail_memalign___m128i(0x10,(long)iVar60);
      pvHSStore = parasail_memalign___m128i(0x10,(long)iVar60);
      pvHSLoad = parasail_memalign___m128i(0x10,(long)iVar60);
      pvHLStore = parasail_memalign___m128i(0x10,(long)iVar60);
      pvHLLoad = parasail_memalign___m128i(0x10,(long)iVar60);
      pvE = parasail_memalign___m128i(0x10,(long)iVar60);
      ptr = parasail_memalign___m128i(0x10,(long)iVar60);
      b = parasail_memalign___m128i(0x10,(long)iVar60);
      b_00 = parasail_memalign___m128i(0x10,(long)iVar60);
      b_01 = parasail_memalign___m128i(0x10,(long)iVar60);
      ptr_00 = parasail_memalign_int16_t(0x10,(long)(s2Len + 1));
      if (pvHLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHMStore == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHMLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHSStore == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHSLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHLStore == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHLLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvE == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (int16_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        alVar100[0] = (long)iVar60;
        alVar100[1] = extraout_RDX;
        parasail_memset___m128i(pvHMLoad,alVar100,len);
        alVar101[0] = (long)iVar60;
        alVar101[1] = extraout_RDX_00;
        parasail_memset___m128i(pvHSLoad,alVar101,len);
        alVar102[0] = (long)iVar60;
        alVar102[1] = extraout_RDX_01;
        parasail_memset___m128i(pvHLLoad,alVar102,len);
        alVar103[0] = (long)iVar60;
        alVar103[1] = extraout_RDX_02;
        parasail_memset___m128i(b,alVar103,len);
        alVar104[0] = (long)iVar60;
        alVar104[1] = extraout_RDX_03;
        parasail_memset___m128i(b_00,alVar104,len);
        alVar105[0] = (long)iVar60;
        alVar105[1] = extraout_RDX_04;
        parasail_memset___m128i(b_01,alVar105,len);
        h.m[1]._4_4_ = 0;
        for (k = 0; k < iVar60; k = k + 1) {
          for (h.m[1]._0_4_ = 0; (int)h.m[1]._0_4_ < 8; h.m[1]._0_4_ = h.m[1]._0_4_ + 1) {
            if (s1_beg == 0) {
              local_127c = -(gap * (h.m[1]._0_4_ * iVar60 + k)) - open;
            }
            else {
              local_127c = 0;
            }
            local_1290 = (long)local_127c;
            local_1288 = local_1290;
            if (local_1290 < -0x8000) {
              local_1288 = -0x8000;
            }
            *(short *)((long)&e + (long)(int)h.m[1]._0_4_ * 2 + 8) = (short)local_1288;
            local_1290 = local_1290 - open;
            if (local_1290 < -0x8000) {
              local_1290 = -0x8000;
            }
            *(short *)((long)&tmp + (long)(int)h.m[1]._0_4_ * 2) = (short)local_1290;
          }
          pvHLoad[(int)h.m[1]._4_4_][0] = e.m[1];
          pvHLoad[(int)h.m[1]._4_4_][1] = h.m[0];
          ptr[(int)h.m[1]._4_4_][0] = tmp;
          ptr[(int)h.m[1]._4_4_][1] = e.m[0];
          h.m[1]._4_4_ = h.m[1]._4_4_ + 1;
        }
        *ptr_00 = 0;
        for (k = 1; k <= s2Len; k = k + 1) {
          if (s2_beg == 0) {
            local_1294 = -(gap * (k + -1)) - open;
          }
          else {
            local_1294 = 0;
          }
          if (local_1294 < -0x8000) {
            local_1294 = -0x8000;
          }
          ptr_00[k] = (int16_t)local_1294;
        }
        vMaxH[1] = lVar13;
        vSaturationCheckMax[0] = lVar16;
        for (s1Len = 0; s1Len < s2Len; s1Len = s1Len + 1) {
          stack0xffffffffffffef38 = ZEXT816(0);
          stack0xffffffffffffef28 = ZEXT816(0);
          vFL[0] = 0x1000100010001;
          vH[1] = 0x1000100010001;
          uVar70 = pvHLoad[iVar60 + -1][0];
          uVar84 = pvHMLoad[iVar60 + -1][0];
          uVar17 = pvHSLoad[iVar60 + -1][0];
          uVar18 = pvHLLoad[iVar60 + -1][0];
          vH[0] = pvHLoad[iVar60 + -1][1] << 0x10 | uVar70 >> 0x30;
          vHM[0] = pvHMLoad[iVar60 + -1][1] << 0x10 | uVar84 >> 0x30;
          vHS[1] = uVar84 << 0x10;
          vHS[0] = pvHSLoad[iVar60 + -1][1] << 0x10 | uVar17 >> 0x30;
          vHL[1] = uVar17 << 0x10;
          vHL[0] = pvHLLoad[iVar60 + -1][1] << 0x10 | uVar18 >> 0x30;
          vP = (__m128i *)(uVar18 << 0x10);
          vH_dag[1] = uVar70 << 0x10 | (ulong)(ushort)ptr_00[s1Len];
          iVar65 = ppVar3->mapper[(byte)s2[s1Len]] * iVar60;
          iVar62 = ppVar3->mapper[(byte)s2[s1Len]];
          iVar2 = ppVar3->mapper[(byte)s2[s1Len]];
          palVar7 = pvHMStore;
          palVar8 = pvHSStore;
          palVar9 = pvHLStore;
          palVar10 = pvE;
          vF_ext[1] = lVar13;
          vF[0] = lVar16;
          for (k = 0; k < iVar60; k = k + 1) {
            palVar63 = ptr + k;
            lVar19 = (*palVar63)[0];
            lVar20 = (*palVar63)[1];
            alVar100 = *palVar63;
            alVar104 = b[k];
            alVar101 = b[k];
            alVar105 = b_00[k];
            alVar102 = b_00[k];
            alVar57 = b_01[k];
            alVar103 = b_01[k];
            auVar94._8_8_ = vH[0];
            auVar94._0_8_ = vH_dag[1];
            auVar71 = paddsw(auVar94,*(undefined1 (*) [16])
                                      ((long)pvVar4 + (long)k * 0x10 + (long)iVar65 * 0x10));
            local_6c8 = auVar71._0_2_;
            uStack_6c6 = auVar71._2_2_;
            uStack_6c4 = auVar71._4_2_;
            uStack_6c2 = auVar71._6_2_;
            uStack_6c0 = auVar71._8_2_;
            uStack_6be = auVar71._10_2_;
            uStack_6bc = auVar71._12_2_;
            uStack_6ba = auVar71._14_2_;
            local_6d8 = (short)lVar19;
            sStack_6d6 = (short)((ulong)lVar19 >> 0x10);
            sStack_6d4 = (short)((ulong)lVar19 >> 0x20);
            sStack_6d2 = (short)((ulong)lVar19 >> 0x30);
            sStack_6d0 = (short)lVar20;
            sStack_6ce = (short)((ulong)lVar20 >> 0x10);
            sStack_6cc = (short)((ulong)lVar20 >> 0x20);
            sStack_6ca = (short)((ulong)lVar20 >> 0x30);
            uVar67 = (ushort)((short)local_6c8 < local_6d8) * local_6d8 |
                     ((short)local_6c8 >= local_6d8) * local_6c8;
            uVar72 = (ushort)((short)uStack_6c6 < sStack_6d6) * sStack_6d6 |
                     ((short)uStack_6c6 >= sStack_6d6) * uStack_6c6;
            uVar75 = (ushort)((short)uStack_6c4 < sStack_6d4) * sStack_6d4 |
                     ((short)uStack_6c4 >= sStack_6d4) * uStack_6c4;
            uVar78 = (ushort)((short)uStack_6c2 < sStack_6d2) * sStack_6d2 |
                     ((short)uStack_6c2 >= sStack_6d2) * uStack_6c2;
            uVar81 = (ushort)((short)uStack_6c0 < sStack_6d0) * sStack_6d0 |
                     ((short)uStack_6c0 >= sStack_6d0) * uStack_6c0;
            uVar85 = (ushort)((short)uStack_6be < sStack_6ce) * sStack_6ce |
                     ((short)uStack_6be >= sStack_6ce) * uStack_6be;
            uVar88 = (ushort)((short)uStack_6bc < sStack_6cc) * sStack_6cc |
                     ((short)uStack_6bc >= sStack_6cc) * uStack_6bc;
            uVar91 = (ushort)((short)uStack_6ba < sStack_6ca) * sStack_6ca |
                     ((short)uStack_6ba >= sStack_6ca) * uStack_6ba;
            local_6f8 = (ushort)vF_ext[1];
            uStack_6f6 = (ushort)((ulong)vF_ext[1] >> 0x10);
            uStack_6f4 = (ushort)((ulong)vF_ext[1] >> 0x20);
            uStack_6f2 = (ushort)((ulong)vF_ext[1] >> 0x30);
            uStack_6f0 = (ushort)vF[0];
            uStack_6ee = (ushort)((ulong)vF[0] >> 0x10);
            uStack_6ec = (ushort)((ulong)vF[0] >> 0x20);
            uStack_6ea = (ushort)((ulong)vF[0] >> 0x30);
            uVar67 = ((short)uVar67 < (short)local_6f8) * local_6f8 |
                     ((short)uVar67 >= (short)local_6f8) * uVar67;
            uVar72 = ((short)uVar72 < (short)uStack_6f6) * uStack_6f6 |
                     ((short)uVar72 >= (short)uStack_6f6) * uVar72;
            uVar75 = ((short)uVar75 < (short)uStack_6f4) * uStack_6f4 |
                     ((short)uVar75 >= (short)uStack_6f4) * uVar75;
            uVar78 = ((short)uVar78 < (short)uStack_6f2) * uStack_6f2 |
                     ((short)uVar78 >= (short)uStack_6f2) * uVar78;
            uVar81 = ((short)uVar81 < (short)uStack_6f0) * uStack_6f0 |
                     ((short)uVar81 >= (short)uStack_6f0) * uVar81;
            uVar85 = ((short)uVar85 < (short)uStack_6ee) * uStack_6ee |
                     ((short)uVar85 >= (short)uStack_6ee) * uVar85;
            uVar88 = ((short)uVar88 < (short)uStack_6ec) * uStack_6ec |
                     ((short)uVar88 >= (short)uStack_6ec) * uVar88;
            uVar91 = ((short)uVar91 < (short)uStack_6ea) * uStack_6ea |
                     ((short)uVar91 >= (short)uStack_6ea) * uVar91;
            vH_dag[1]._0_4_ = CONCAT22(uVar72,uVar67);
            vH_dag[1]._0_6_ = CONCAT24(uVar75,(undefined4)vH_dag[1]);
            vH_dag[1] = CONCAT26(uVar78,(undefined6)vH_dag[1]);
            vH[0]._0_4_ = CONCAT22(uVar85,uVar81);
            vH[0]._0_6_ = CONCAT24(uVar88,(undefined4)vH[0]);
            vH[0] = CONCAT26(uVar91,(undefined6)vH[0]);
            pvHMStore[k][0] = vH_dag[1];
            pvHMStore[k][1] = vH[0];
            sVar68 = -(ushort)(uVar67 == local_6c8);
            sVar73 = -(ushort)(uVar72 == uStack_6c6);
            sVar76 = -(ushort)(uVar75 == uStack_6c4);
            sVar79 = -(ushort)(uVar78 == uStack_6c2);
            sVar82 = -(ushort)(uVar81 == uStack_6c0);
            sVar86 = -(ushort)(uVar85 == uStack_6be);
            sVar89 = -(ushort)(uVar88 == uStack_6bc);
            sVar92 = -(ushort)(uVar91 == uStack_6ba);
            sVar69 = -(ushort)(uVar67 == local_6f8);
            sVar74 = -(ushort)(uVar72 == uStack_6f6);
            sVar77 = -(ushort)(uVar75 == uStack_6f4);
            sVar80 = -(ushort)(uVar78 == uStack_6f2);
            sVar83 = -(ushort)(uVar81 == uStack_6f0);
            sVar87 = -(ushort)(uVar85 == uStack_6ee);
            sVar90 = -(ushort)(uVar88 == uStack_6ec);
            sVar93 = -(ushort)(uVar91 == uStack_6ea);
            auVar44._2_2_ = sVar74;
            auVar44._0_2_ = sVar69;
            auVar44._4_2_ = sVar77;
            auVar44._6_2_ = sVar80;
            auVar44._10_2_ = sVar87;
            auVar44._8_2_ = sVar83;
            auVar44._12_2_ = sVar90;
            auVar44._14_2_ = sVar93;
            auVar98 = pblendvb((undefined1  [16])alVar104,stack0xffffffffffffef38,auVar44);
            auVar71 = paddsw((undefined1  [16])stack0xffffffffffffeee8,
                             *(undefined1 (*) [16])
                              ((long)pvVar5 + (long)k * 0x10 + (long)(iVar62 * iVar60) * 0x10));
            auVar43._2_2_ = sVar73;
            auVar43._0_2_ = sVar68;
            auVar43._4_2_ = sVar76;
            auVar43._6_2_ = sVar79;
            auVar43._10_2_ = sVar86;
            auVar43._8_2_ = sVar82;
            auVar43._12_2_ = sVar89;
            auVar43._14_2_ = sVar92;
            auVar94 = pblendvb(auVar98,auVar71,auVar43);
            vHS[1] = auVar94._0_8_;
            vHM[0] = auVar94._8_8_;
            pvHSStore[k][0] = vHS[1];
            pvHSStore[k][1] = vHM[0];
            auVar42._2_2_ = sVar74;
            auVar42._0_2_ = sVar69;
            auVar42._4_2_ = sVar77;
            auVar42._6_2_ = sVar80;
            auVar42._10_2_ = sVar87;
            auVar42._8_2_ = sVar83;
            auVar42._12_2_ = sVar90;
            auVar42._14_2_ = sVar93;
            auVar98 = pblendvb((undefined1  [16])alVar105,stack0xffffffffffffef28,auVar42);
            auVar71 = paddsw((undefined1  [16])stack0xffffffffffffeed8,
                             *(undefined1 (*) [16])
                              ((long)pvVar6 + (long)k * 0x10 + (long)(iVar2 * iVar60) * 0x10));
            auVar41._2_2_ = sVar73;
            auVar41._0_2_ = sVar68;
            auVar41._4_2_ = sVar76;
            auVar41._6_2_ = sVar79;
            auVar41._10_2_ = sVar86;
            auVar41._8_2_ = sVar82;
            auVar41._12_2_ = sVar89;
            auVar41._14_2_ = sVar92;
            auVar95 = pblendvb(auVar98,auVar71,auVar41);
            vHL[1] = auVar95._0_8_;
            vHS[0] = auVar95._8_8_;
            pvHLStore[k][0] = vHL[1];
            pvHLStore[k][1] = vHS[0];
            auVar40._2_2_ = sVar74;
            auVar40._0_2_ = sVar69;
            auVar40._4_2_ = sVar77;
            auVar40._6_2_ = sVar80;
            auVar40._10_2_ = sVar87;
            auVar40._8_2_ = sVar83;
            auVar40._12_2_ = sVar90;
            auVar40._14_2_ = sVar93;
            auVar98 = pblendvb((undefined1  [16])alVar57,stack0xffffffffffffef18,auVar40);
            auVar96._8_8_ = 0x1000100010001;
            auVar96._0_8_ = 0x1000100010001;
            auVar71 = paddsw((undefined1  [16])_vP,auVar96);
            auVar39._2_2_ = sVar73;
            auVar39._0_2_ = sVar68;
            auVar39._4_2_ = sVar76;
            auVar39._6_2_ = sVar79;
            auVar39._10_2_ = sVar86;
            auVar39._8_2_ = sVar82;
            auVar39._12_2_ = sVar89;
            auVar39._14_2_ = sVar92;
            auVar96 = pblendvb(auVar98,auVar71,auVar39);
            vP = auVar96._0_8_;
            vHL[0] = auVar96._8_8_;
            pvE[k][0] = (longlong)vP;
            pvE[k][1] = vHL[0];
            local_268 = (short)vSaturationCheckMax[1];
            sStack_266 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
            sStack_264 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
            sStack_262 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
            sStack_260 = (short)vSaturationCheckMin[0];
            sStack_25e = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
            sStack_25c = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
            sStack_25a = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
            vSaturationCheckMax[1]._0_4_ =
                 CONCAT22(((short)uVar72 < sStack_266) * uVar72 |
                          (ushort)((short)uVar72 >= sStack_266) * sStack_266,
                          ((short)uVar67 < local_268) * uVar67 |
                          (ushort)((short)uVar67 >= local_268) * local_268);
            vSaturationCheckMax[1]._0_6_ =
                 CONCAT24(((short)uVar75 < sStack_264) * uVar75 |
                          (ushort)((short)uVar75 >= sStack_264) * sStack_264,
                          (undefined4)vSaturationCheckMax[1]);
            vSaturationCheckMax[1] =
                 CONCAT26(((short)uVar78 < sStack_262) * uVar78 |
                          (ushort)((short)uVar78 >= sStack_262) * sStack_262,
                          (undefined6)vSaturationCheckMax[1]);
            vSaturationCheckMin[0]._0_4_ =
                 CONCAT22(((short)uVar85 < sStack_25e) * uVar85 |
                          (ushort)((short)uVar85 >= sStack_25e) * sStack_25e,
                          ((short)uVar81 < sStack_260) * uVar81 |
                          (ushort)((short)uVar81 >= sStack_260) * sStack_260);
            vSaturationCheckMin[0]._0_6_ =
                 CONCAT24(((short)uVar88 < sStack_25c) * uVar88 |
                          (ushort)((short)uVar88 >= sStack_25c) * sStack_25c,
                          (undefined4)vSaturationCheckMin[0]);
            vSaturationCheckMin[0] =
                 CONCAT26(((short)uVar91 < sStack_25a) * uVar91 |
                          (ushort)((short)uVar91 >= sStack_25a) * sStack_25a,
                          (undefined6)vSaturationCheckMin[0]);
            local_708 = (short)vMaxH[1];
            sStack_706 = (short)((ulong)vMaxH[1] >> 0x10);
            sStack_704 = (short)((ulong)vMaxH[1] >> 0x20);
            sStack_702 = (short)((ulong)vMaxH[1] >> 0x30);
            sStack_700 = (short)vSaturationCheckMax[0];
            sStack_6fe = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
            sStack_6fc = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
            sStack_6fa = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
            uVar67 = (local_708 < (short)uVar67) * uVar67 |
                     (ushort)(local_708 >= (short)uVar67) * local_708;
            uVar72 = (sStack_706 < (short)uVar72) * uVar72 |
                     (ushort)(sStack_706 >= (short)uVar72) * sStack_706;
            uVar75 = (sStack_704 < (short)uVar75) * uVar75 |
                     (ushort)(sStack_704 >= (short)uVar75) * sStack_704;
            uVar78 = (sStack_702 < (short)uVar78) * uVar78 |
                     (ushort)(sStack_702 >= (short)uVar78) * sStack_702;
            uVar81 = (sStack_700 < (short)uVar81) * uVar81 |
                     (ushort)(sStack_700 >= (short)uVar81) * sStack_700;
            uVar85 = (sStack_6fe < (short)uVar85) * uVar85 |
                     (ushort)(sStack_6fe >= (short)uVar85) * sStack_6fe;
            uVar88 = (sStack_6fc < (short)uVar88) * uVar88 |
                     (ushort)(sStack_6fc >= (short)uVar88) * sStack_6fc;
            uVar91 = (sStack_6fa < (short)uVar91) * uVar91 |
                     (ushort)(sStack_6fa >= (short)uVar91) * sStack_6fa;
            local_738 = auVar94._0_2_;
            sStack_736 = auVar94._2_2_;
            sStack_734 = auVar94._4_2_;
            sStack_732 = auVar94._6_2_;
            sStack_730 = auVar94._8_2_;
            sStack_72e = auVar94._10_2_;
            sStack_72c = auVar94._12_2_;
            sStack_72a = auVar94._14_2_;
            uVar67 = (ushort)((short)uVar67 < local_738) * local_738 |
                     ((short)uVar67 >= local_738) * uVar67;
            uVar72 = (ushort)((short)uVar72 < sStack_736) * sStack_736 |
                     ((short)uVar72 >= sStack_736) * uVar72;
            uVar75 = (ushort)((short)uVar75 < sStack_734) * sStack_734 |
                     ((short)uVar75 >= sStack_734) * uVar75;
            uVar78 = (ushort)((short)uVar78 < sStack_732) * sStack_732 |
                     ((short)uVar78 >= sStack_732) * uVar78;
            uVar81 = (ushort)((short)uVar81 < sStack_730) * sStack_730 |
                     ((short)uVar81 >= sStack_730) * uVar81;
            uVar85 = (ushort)((short)uVar85 < sStack_72e) * sStack_72e |
                     ((short)uVar85 >= sStack_72e) * uVar85;
            uVar88 = (ushort)((short)uVar88 < sStack_72c) * sStack_72c |
                     ((short)uVar88 >= sStack_72c) * uVar88;
            uVar91 = (ushort)((short)uVar91 < sStack_72a) * sStack_72a |
                     ((short)uVar91 >= sStack_72a) * uVar91;
            local_758 = auVar95._0_2_;
            sStack_756 = auVar95._2_2_;
            sStack_754 = auVar95._4_2_;
            sStack_752 = auVar95._6_2_;
            sStack_750 = auVar95._8_2_;
            sStack_74e = auVar95._10_2_;
            sStack_74c = auVar95._12_2_;
            sStack_74a = auVar95._14_2_;
            uVar67 = (ushort)((short)uVar67 < local_758) * local_758 |
                     ((short)uVar67 >= local_758) * uVar67;
            uVar72 = (ushort)((short)uVar72 < sStack_756) * sStack_756 |
                     ((short)uVar72 >= sStack_756) * uVar72;
            uVar75 = (ushort)((short)uVar75 < sStack_754) * sStack_754 |
                     ((short)uVar75 >= sStack_754) * uVar75;
            uVar78 = (ushort)((short)uVar78 < sStack_752) * sStack_752 |
                     ((short)uVar78 >= sStack_752) * uVar78;
            uVar81 = (ushort)((short)uVar81 < sStack_750) * sStack_750 |
                     ((short)uVar81 >= sStack_750) * uVar81;
            uVar85 = (ushort)((short)uVar85 < sStack_74e) * sStack_74e |
                     ((short)uVar85 >= sStack_74e) * uVar85;
            uVar88 = (ushort)((short)uVar88 < sStack_74c) * sStack_74c |
                     ((short)uVar88 >= sStack_74c) * uVar88;
            uVar91 = (ushort)((short)uVar91 < sStack_74a) * sStack_74a |
                     ((short)uVar91 >= sStack_74a) * uVar91;
            local_778 = auVar96._0_2_;
            sStack_776 = auVar96._2_2_;
            sStack_774 = auVar96._4_2_;
            sStack_772 = auVar96._6_2_;
            sStack_770 = auVar96._8_2_;
            sStack_76e = auVar96._10_2_;
            sStack_76c = auVar96._12_2_;
            sStack_76a = auVar96._14_2_;
            vMaxH[1]._0_4_ =
                 CONCAT22((ushort)((short)uVar72 < sStack_776) * sStack_776 |
                          ((short)uVar72 >= sStack_776) * uVar72,
                          (ushort)((short)uVar67 < local_778) * local_778 |
                          ((short)uVar67 >= local_778) * uVar67);
            vMaxH[1]._0_6_ =
                 CONCAT24((ushort)((short)uVar75 < sStack_774) * sStack_774 |
                          ((short)uVar75 >= sStack_774) * uVar75,(undefined4)vMaxH[1]);
            vMaxH[1] = CONCAT26((ushort)((short)uVar78 < sStack_772) * sStack_772 |
                                ((short)uVar78 >= sStack_772) * uVar78,(undefined6)vMaxH[1]);
            vSaturationCheckMax[0]._0_4_ =
                 CONCAT22((ushort)((short)uVar85 < sStack_76e) * sStack_76e |
                          ((short)uVar85 >= sStack_76e) * uVar85,
                          (ushort)((short)uVar81 < sStack_770) * sStack_770 |
                          ((short)uVar81 >= sStack_770) * uVar81);
            vSaturationCheckMax[0]._0_6_ =
                 CONCAT24((ushort)((short)uVar88 < sStack_76c) * sStack_76c |
                          ((short)uVar88 >= sStack_76c) * uVar88,(undefined4)vSaturationCheckMax[0])
            ;
            vSaturationCheckMax[0] =
                 CONCAT26((ushort)((short)uVar91 < sStack_76a) * sStack_76a |
                          ((short)uVar91 >= sStack_76a) * uVar91,(undefined6)vSaturationCheckMax[0])
            ;
            auVar53._8_8_ = vH[0];
            auVar53._0_8_ = vH_dag[1];
            auVar52._8_8_ = uVar14;
            auVar52._0_8_ = uVar11;
            auVar71 = psubsw(auVar53,auVar52);
            auVar51._8_8_ = uVar15;
            auVar51._0_8_ = uVar12;
            auVar98 = psubsw((undefined1  [16])alVar100,auVar51);
            local_788 = auVar71._0_2_;
            sStack_786 = auVar71._2_2_;
            sStack_784 = auVar71._4_2_;
            sStack_782 = auVar71._6_2_;
            sStack_780 = auVar71._8_2_;
            sStack_77e = auVar71._10_2_;
            sStack_77c = auVar71._12_2_;
            sStack_77a = auVar71._14_2_;
            local_798 = auVar98._0_2_;
            sStack_796 = auVar98._2_2_;
            sStack_794 = auVar98._4_2_;
            sStack_792 = auVar98._6_2_;
            sStack_790 = auVar98._8_2_;
            sStack_78e = auVar98._10_2_;
            sStack_78c = auVar98._12_2_;
            sStack_78a = auVar98._14_2_;
            vE_ext[1] = CONCAT26((ushort)(sStack_782 < sStack_792) * sStack_792 |
                                 (ushort)(sStack_782 >= sStack_792) * sStack_782,
                                 CONCAT24((ushort)(sStack_784 < sStack_794) * sStack_794 |
                                          (ushort)(sStack_784 >= sStack_794) * sStack_784,
                                          CONCAT22((ushort)(sStack_786 < sStack_796) * sStack_796 |
                                                   (ushort)(sStack_786 >= sStack_796) * sStack_786,
                                                   (ushort)(local_788 < local_798) * local_798 |
                                                   (ushort)(local_788 >= local_798) * local_788)));
            vE[0] = CONCAT26((ushort)(sStack_77a < sStack_78a) * sStack_78a |
                             (ushort)(sStack_77a >= sStack_78a) * sStack_77a,
                             CONCAT24((ushort)(sStack_77c < sStack_78c) * sStack_78c |
                                      (ushort)(sStack_77c >= sStack_78c) * sStack_77c,
                                      CONCAT22((ushort)(sStack_77e < sStack_78e) * sStack_78e |
                                               (ushort)(sStack_77e >= sStack_78e) * sStack_77e,
                                               (ushort)(sStack_780 < sStack_790) * sStack_790 |
                                               (ushort)(sStack_780 >= sStack_790) * sStack_780)));
            sVar68 = -(ushort)(local_798 < local_788);
            sVar69 = -(ushort)(sStack_796 < sStack_786);
            sVar73 = -(ushort)(sStack_794 < sStack_784);
            sVar74 = -(ushort)(sStack_792 < sStack_782);
            sVar76 = -(ushort)(sStack_790 < sStack_780);
            sVar77 = -(ushort)(sStack_78e < sStack_77e);
            sVar79 = -(ushort)(sStack_78c < sStack_77c);
            sVar80 = -(ushort)(sStack_78a < sStack_77a);
            auVar38._2_2_ = sVar69;
            auVar38._0_2_ = sVar68;
            auVar38._4_2_ = sVar73;
            auVar38._6_2_ = sVar74;
            auVar38._10_2_ = sVar77;
            auVar38._8_2_ = sVar76;
            auVar38._12_2_ = sVar79;
            auVar38._14_2_ = sVar80;
            auVar71 = pblendvb((undefined1  [16])alVar101,auVar94,auVar38);
            auVar37._2_2_ = sVar69;
            auVar37._0_2_ = sVar68;
            auVar37._4_2_ = sVar73;
            auVar37._6_2_ = sVar74;
            auVar37._10_2_ = sVar77;
            auVar37._8_2_ = sVar76;
            auVar37._12_2_ = sVar79;
            auVar37._14_2_ = sVar80;
            auVar98 = pblendvb((undefined1  [16])alVar102,auVar95,auVar37);
            auVar99._8_8_ = 0x1000100010001;
            auVar99._0_8_ = 0x1000100010001;
            auVar99 = paddsw((undefined1  [16])alVar103,auVar99);
            auVar97._8_8_ = 0x1000100010001;
            auVar97._0_8_ = 0x1000100010001;
            auVar97 = paddsw(auVar96,auVar97);
            auVar36._2_2_ = sVar69;
            auVar36._0_2_ = sVar68;
            auVar36._4_2_ = sVar73;
            auVar36._6_2_ = sVar74;
            auVar36._10_2_ = sVar77;
            auVar36._8_2_ = sVar76;
            auVar36._12_2_ = sVar79;
            auVar36._14_2_ = sVar80;
            auVar97 = pblendvb(auVar99,auVar97,auVar36);
            ptr[k][0] = vE_ext[1];
            ptr[k][1] = vE[0];
            vES[1] = auVar71._0_8_;
            vEM[0] = auVar71._8_8_;
            b[k][0] = vES[1];
            b[k][1] = vEM[0];
            vEL[1] = auVar98._0_8_;
            vES[0] = auVar98._8_8_;
            b_00[k][0] = vEL[1];
            b_00[k][1] = vES[0];
            vF[1] = auVar97._0_8_;
            vEL[0] = auVar97._8_8_;
            b_01[k][0] = vF[1];
            b_01[k][1] = vEL[0];
            auVar50._8_8_ = vF[0];
            auVar50._0_8_ = vF_ext[1];
            auVar49._8_8_ = uVar15;
            auVar49._0_8_ = uVar12;
            auVar71 = psubsw(auVar50,auVar49);
            local_7b8 = auVar71._0_2_;
            sStack_7b6 = auVar71._2_2_;
            sStack_7b4 = auVar71._4_2_;
            sStack_7b2 = auVar71._6_2_;
            sStack_7b0 = auVar71._8_2_;
            sStack_7ae = auVar71._10_2_;
            sStack_7ac = auVar71._12_2_;
            sStack_7aa = auVar71._14_2_;
            vF_ext[1] = CONCAT26((ushort)(sStack_782 < sStack_7b2) * sStack_7b2 |
                                 (ushort)(sStack_782 >= sStack_7b2) * sStack_782,
                                 CONCAT24((ushort)(sStack_784 < sStack_7b4) * sStack_7b4 |
                                          (ushort)(sStack_784 >= sStack_7b4) * sStack_784,
                                          CONCAT22((ushort)(sStack_786 < sStack_7b6) * sStack_7b6 |
                                                   (ushort)(sStack_786 >= sStack_7b6) * sStack_786,
                                                   (ushort)(local_788 < local_7b8) * local_7b8 |
                                                   (ushort)(local_788 >= local_7b8) * local_788)));
            vF[0] = CONCAT26((ushort)(sStack_77a < sStack_7aa) * sStack_7aa |
                             (ushort)(sStack_77a >= sStack_7aa) * sStack_77a,
                             CONCAT24((ushort)(sStack_77c < sStack_7ac) * sStack_7ac |
                                      (ushort)(sStack_77c >= sStack_7ac) * sStack_77c,
                                      CONCAT22((ushort)(sStack_77e < sStack_7ae) * sStack_7ae |
                                               (ushort)(sStack_77e >= sStack_7ae) * sStack_77e,
                                               (ushort)(sStack_780 < sStack_7b0) * sStack_7b0 |
                                               (ushort)(sStack_780 >= sStack_7b0) * sStack_780)));
            sVar68 = -(ushort)(local_7b8 < local_788);
            sVar69 = -(ushort)(sStack_7b6 < sStack_786);
            sVar73 = -(ushort)(sStack_7b4 < sStack_784);
            sVar74 = -(ushort)(sStack_7b2 < sStack_782);
            sVar76 = -(ushort)(sStack_7b0 < sStack_780);
            sVar77 = -(ushort)(sStack_7ae < sStack_77e);
            sVar79 = -(ushort)(sStack_7ac < sStack_77c);
            sVar80 = -(ushort)(sStack_7aa < sStack_77a);
            auVar35._2_2_ = sVar69;
            auVar35._0_2_ = sVar68;
            auVar35._4_2_ = sVar73;
            auVar35._6_2_ = sVar74;
            auVar35._10_2_ = sVar77;
            auVar35._8_2_ = sVar76;
            auVar35._12_2_ = sVar79;
            auVar35._14_2_ = sVar80;
            register0x00001240 = pblendvb(stack0xffffffffffffef38,auVar94,auVar35);
            auVar34._2_2_ = sVar69;
            auVar34._0_2_ = sVar68;
            auVar34._4_2_ = sVar73;
            auVar34._6_2_ = sVar74;
            auVar34._10_2_ = sVar77;
            auVar34._8_2_ = sVar76;
            auVar34._12_2_ = sVar79;
            auVar34._14_2_ = sVar80;
            register0x00001240 = pblendvb(stack0xffffffffffffef28,auVar95,auVar34);
            auVar98._8_8_ = 0x1000100010001;
            auVar98._0_8_ = 0x1000100010001;
            auVar98 = paddsw(stack0xffffffffffffef18,auVar98);
            auVar71._8_8_ = 0x1000100010001;
            auVar71._0_8_ = 0x1000100010001;
            auVar71 = paddsw(auVar96,auVar71);
            auVar95._2_2_ = sVar69;
            auVar95._0_2_ = sVar68;
            auVar95._4_2_ = sVar73;
            auVar95._6_2_ = sVar74;
            auVar95._10_2_ = sVar77;
            auVar95._8_2_ = sVar76;
            auVar95._12_2_ = sVar79;
            auVar95._14_2_ = sVar80;
            register0x00001240 = pblendvb(auVar98,auVar71,auVar95);
            vH_dag[1] = pvHLoad[k][0];
            vH[0] = pvHLoad[k][1];
            unique0x10005295 = pvHMLoad[k];
            unique0x100052a5 = pvHSLoad[k];
            _vP = pvHLLoad[k];
          }
          for (end_query = 0; end_query < 8; end_query = end_query + 1) {
            uVar70 = pvHLoad[iVar60 + -1][0];
            if (s2_beg == 0) {
              local_12a4 = ptr_00[s1Len + 1] - open;
            }
            else {
              local_12a4 = -open;
            }
            local_12b0 = (ulong)local_12a4;
            if ((long)local_12b0 < -0x8000) {
              local_12b0 = 0xffffffffffff8000;
            }
            vF[0] = vF[0] << 0x10 | (ulong)vF_ext[1] >> 0x30;
            vFM[0] = vFM[0] << 0x10 | (ulong)vFS[1] >> 0x30;
            vFS[1] = vFS[1] << 0x10;
            vFS[0] = vFS[0] << 0x10 | (ulong)vFL[1] >> 0x30;
            vFL[1] = vFL[1] << 0x10;
            vHp[0] = pvHLoad[iVar60 + -1][1] << 0x10 | uVar70 >> 0x30;
            tmp_6 = uVar70 << 0x10 | (ulong)(ushort)ptr_00[s1Len];
            vF_ext[1] = vF_ext[1] << 0x10 | local_12b0 & 0xffff;
            vFL[0] = vFL[0] << 0x10 | (ulong)vH[1] >> 0x30;
            vH[1] = vH[1] << 0x10 | 1;
            for (k = 0; k < iVar60; k = k + 1) {
              auVar71 = paddsw((undefined1  [16])_tmp_6,
                               *(undefined1 (*) [16])
                                ((long)pvVar4 + (long)k * 0x10 + (long)iVar65 * 0x10));
              lVar19 = pvHMStore[k][0];
              lVar20 = pvHMStore[k][1];
              local_7c8 = (short)lVar19;
              sStack_7c6 = (short)((ulong)lVar19 >> 0x10);
              sStack_7c4 = (short)((ulong)lVar19 >> 0x20);
              sStack_7c2 = (short)((ulong)lVar19 >> 0x30);
              sStack_7c0 = (short)lVar20;
              sStack_7be = (short)((ulong)lVar20 >> 0x10);
              sStack_7bc = (short)((ulong)lVar20 >> 0x20);
              sStack_7ba = (short)((ulong)lVar20 >> 0x30);
              local_7d8 = (ushort)vF_ext[1];
              uStack_7d6 = (ushort)((ulong)vF_ext[1] >> 0x10);
              uStack_7d4 = (ushort)((ulong)vF_ext[1] >> 0x20);
              uStack_7d2 = (ushort)((ulong)vF_ext[1] >> 0x30);
              uStack_7d0 = (ushort)vF[0];
              uStack_7ce = (ushort)((ulong)vF[0] >> 0x10);
              uStack_7cc = (ushort)((ulong)vF[0] >> 0x20);
              uStack_7ca = (ushort)((ulong)vF[0] >> 0x30);
              uVar67 = (local_7c8 < (short)local_7d8) * local_7d8 |
                       (ushort)(local_7c8 >= (short)local_7d8) * local_7c8;
              uVar72 = (sStack_7c6 < (short)uStack_7d6) * uStack_7d6 |
                       (ushort)(sStack_7c6 >= (short)uStack_7d6) * sStack_7c6;
              uVar75 = (sStack_7c4 < (short)uStack_7d4) * uStack_7d4 |
                       (ushort)(sStack_7c4 >= (short)uStack_7d4) * sStack_7c4;
              uVar78 = (sStack_7c2 < (short)uStack_7d2) * uStack_7d2 |
                       (ushort)(sStack_7c2 >= (short)uStack_7d2) * sStack_7c2;
              uVar81 = (sStack_7c0 < (short)uStack_7d0) * uStack_7d0 |
                       (ushort)(sStack_7c0 >= (short)uStack_7d0) * sStack_7c0;
              uVar85 = (sStack_7be < (short)uStack_7ce) * uStack_7ce |
                       (ushort)(sStack_7be >= (short)uStack_7ce) * sStack_7be;
              uVar88 = (sStack_7bc < (short)uStack_7cc) * uStack_7cc |
                       (ushort)(sStack_7bc >= (short)uStack_7cc) * sStack_7bc;
              uVar91 = (sStack_7ba < (short)uStack_7ca) * uStack_7ca |
                       (ushort)(sStack_7ba >= (short)uStack_7ca) * sStack_7ba;
              vH_dag[1]._0_4_ = CONCAT22(uVar72,uVar67);
              vH_dag[1]._0_6_ = CONCAT24(uVar75,(undefined4)vH_dag[1]);
              vH_dag[1] = CONCAT26(uVar78,(undefined6)vH_dag[1]);
              vH[0]._0_4_ = CONCAT22(uVar85,uVar81);
              vH[0]._0_6_ = CONCAT24(uVar88,(undefined4)vH[0]);
              vH[0] = CONCAT26(uVar91,(undefined6)vH[0]);
              pvHMStore[k][0] = vH_dag[1];
              pvHMStore[k][1] = vH[0];
              local_dc8 = auVar71._0_2_;
              uStack_dc6 = auVar71._2_2_;
              uStack_dc4 = auVar71._4_2_;
              uStack_dc2 = auVar71._6_2_;
              uStack_dc0 = auVar71._8_2_;
              uStack_dbe = auVar71._10_2_;
              uStack_dbc = auVar71._12_2_;
              uStack_dba = auVar71._14_2_;
              uVar70 = ~CONCAT26(-(ushort)(uVar78 == uStack_dc2),
                                 CONCAT24(-(ushort)(uVar75 == uStack_dc4),
                                          CONCAT22(-(ushort)(uVar72 == uStack_dc6),
                                                   -(ushort)(uVar67 == local_dc8)))) &
                       CONCAT26(-(ushort)(uVar78 == uStack_7d2),
                                CONCAT24(-(ushort)(uVar75 == uStack_7d4),
                                         CONCAT22(-(ushort)(uVar72 == uStack_7d6),
                                                  -(ushort)(uVar67 == local_7d8))));
              uVar84 = ~CONCAT26(-(ushort)(uVar91 == uStack_dba),
                                 CONCAT24(-(ushort)(uVar88 == uStack_dbc),
                                          CONCAT22(-(ushort)(uVar85 == uStack_dbe),
                                                   -(ushort)(uVar81 == uStack_dc0)))) &
                       CONCAT26(-(ushort)(uVar91 == uStack_7ca),
                                CONCAT24(-(ushort)(uVar88 == uStack_7cc),
                                         CONCAT22(-(ushort)(uVar85 == uStack_7ce),
                                                  -(ushort)(uVar81 == uStack_7d0))));
              auVar33._8_8_ = uVar84;
              auVar33._0_8_ = uVar70;
              auVar97 = pblendvb((undefined1  [16])pvHSStore[k],stack0xffffffffffffef38,auVar33);
              vHS[1] = auVar97._0_8_;
              vHM[0] = auVar97._8_8_;
              pvHSStore[k][0] = vHS[1];
              pvHSStore[k][1] = vHM[0];
              auVar32._8_8_ = uVar84;
              auVar32._0_8_ = uVar70;
              auVar99 = pblendvb((undefined1  [16])pvHLStore[k],stack0xffffffffffffef28,auVar32);
              vHL[1] = auVar99._0_8_;
              vHS[0] = auVar99._8_8_;
              pvHLStore[k][0] = vHL[1];
              pvHLStore[k][1] = vHS[0];
              auVar31._8_8_ = uVar84;
              auVar31._0_8_ = uVar70;
              auVar96 = pblendvb((undefined1  [16])pvE[k],stack0xffffffffffffef18,auVar31);
              vP = auVar96._0_8_;
              vHL[0] = auVar96._8_8_;
              pvE[k][0] = (longlong)vP;
              pvE[k][1] = vHL[0];
              local_288 = (short)vSaturationCheckMax[1];
              sStack_286 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
              sStack_284 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
              sStack_282 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
              sStack_280 = (short)vSaturationCheckMin[0];
              sStack_27e = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
              sStack_27c = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
              sStack_27a = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
              vSaturationCheckMax[1]._0_4_ =
                   CONCAT22(((short)uVar72 < sStack_286) * uVar72 |
                            (ushort)((short)uVar72 >= sStack_286) * sStack_286,
                            ((short)uVar67 < local_288) * uVar67 |
                            (ushort)((short)uVar67 >= local_288) * local_288);
              vSaturationCheckMax[1]._0_6_ =
                   CONCAT24(((short)uVar75 < sStack_284) * uVar75 |
                            (ushort)((short)uVar75 >= sStack_284) * sStack_284,
                            (undefined4)vSaturationCheckMax[1]);
              vSaturationCheckMax[1] =
                   CONCAT26(((short)uVar78 < sStack_282) * uVar78 |
                            (ushort)((short)uVar78 >= sStack_282) * sStack_282,
                            (undefined6)vSaturationCheckMax[1]);
              vSaturationCheckMin[0]._0_4_ =
                   CONCAT22(((short)uVar85 < sStack_27e) * uVar85 |
                            (ushort)((short)uVar85 >= sStack_27e) * sStack_27e,
                            ((short)uVar81 < sStack_280) * uVar81 |
                            (ushort)((short)uVar81 >= sStack_280) * sStack_280);
              vSaturationCheckMin[0]._0_6_ =
                   CONCAT24(((short)uVar88 < sStack_27c) * uVar88 |
                            (ushort)((short)uVar88 >= sStack_27c) * sStack_27c,
                            (undefined4)vSaturationCheckMin[0]);
              vSaturationCheckMin[0] =
                   CONCAT26(((short)uVar91 < sStack_27a) * uVar91 |
                            (ushort)((short)uVar91 >= sStack_27a) * sStack_27a,
                            (undefined6)vSaturationCheckMin[0]);
              local_7e8 = (short)vMaxH[1];
              sStack_7e6 = (short)((ulong)vMaxH[1] >> 0x10);
              sStack_7e4 = (short)((ulong)vMaxH[1] >> 0x20);
              sStack_7e2 = (short)((ulong)vMaxH[1] >> 0x30);
              sStack_7e0 = (short)vSaturationCheckMax[0];
              sStack_7de = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
              sStack_7dc = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
              sStack_7da = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
              uVar67 = (local_7e8 < (short)uVar67) * uVar67 |
                       (ushort)(local_7e8 >= (short)uVar67) * local_7e8;
              uVar72 = (sStack_7e6 < (short)uVar72) * uVar72 |
                       (ushort)(sStack_7e6 >= (short)uVar72) * sStack_7e6;
              uVar75 = (sStack_7e4 < (short)uVar75) * uVar75 |
                       (ushort)(sStack_7e4 >= (short)uVar75) * sStack_7e4;
              uVar78 = (sStack_7e2 < (short)uVar78) * uVar78 |
                       (ushort)(sStack_7e2 >= (short)uVar78) * sStack_7e2;
              uVar81 = (sStack_7e0 < (short)uVar81) * uVar81 |
                       (ushort)(sStack_7e0 >= (short)uVar81) * sStack_7e0;
              uVar85 = (sStack_7de < (short)uVar85) * uVar85 |
                       (ushort)(sStack_7de >= (short)uVar85) * sStack_7de;
              uVar88 = (sStack_7dc < (short)uVar88) * uVar88 |
                       (ushort)(sStack_7dc >= (short)uVar88) * sStack_7dc;
              uVar91 = (sStack_7da < (short)uVar91) * uVar91 |
                       (ushort)(sStack_7da >= (short)uVar91) * sStack_7da;
              local_818 = auVar97._0_2_;
              sStack_816 = auVar97._2_2_;
              sStack_814 = auVar97._4_2_;
              sStack_812 = auVar97._6_2_;
              sStack_810 = auVar97._8_2_;
              sStack_80e = auVar97._10_2_;
              sStack_80c = auVar97._12_2_;
              sStack_80a = auVar97._14_2_;
              uVar67 = (ushort)((short)uVar67 < local_818) * local_818 |
                       ((short)uVar67 >= local_818) * uVar67;
              uVar72 = (ushort)((short)uVar72 < sStack_816) * sStack_816 |
                       ((short)uVar72 >= sStack_816) * uVar72;
              uVar75 = (ushort)((short)uVar75 < sStack_814) * sStack_814 |
                       ((short)uVar75 >= sStack_814) * uVar75;
              uVar78 = (ushort)((short)uVar78 < sStack_812) * sStack_812 |
                       ((short)uVar78 >= sStack_812) * uVar78;
              uVar81 = (ushort)((short)uVar81 < sStack_810) * sStack_810 |
                       ((short)uVar81 >= sStack_810) * uVar81;
              uVar85 = (ushort)((short)uVar85 < sStack_80e) * sStack_80e |
                       ((short)uVar85 >= sStack_80e) * uVar85;
              uVar88 = (ushort)((short)uVar88 < sStack_80c) * sStack_80c |
                       ((short)uVar88 >= sStack_80c) * uVar88;
              uVar91 = (ushort)((short)uVar91 < sStack_80a) * sStack_80a |
                       ((short)uVar91 >= sStack_80a) * uVar91;
              local_838 = auVar99._0_2_;
              sStack_836 = auVar99._2_2_;
              sStack_834 = auVar99._4_2_;
              sStack_832 = auVar99._6_2_;
              sStack_830 = auVar99._8_2_;
              sStack_82e = auVar99._10_2_;
              sStack_82c = auVar99._12_2_;
              sStack_82a = auVar99._14_2_;
              uVar67 = (ushort)((short)uVar67 < local_838) * local_838 |
                       ((short)uVar67 >= local_838) * uVar67;
              uVar72 = (ushort)((short)uVar72 < sStack_836) * sStack_836 |
                       ((short)uVar72 >= sStack_836) * uVar72;
              uVar75 = (ushort)((short)uVar75 < sStack_834) * sStack_834 |
                       ((short)uVar75 >= sStack_834) * uVar75;
              uVar78 = (ushort)((short)uVar78 < sStack_832) * sStack_832 |
                       ((short)uVar78 >= sStack_832) * uVar78;
              uVar81 = (ushort)((short)uVar81 < sStack_830) * sStack_830 |
                       ((short)uVar81 >= sStack_830) * uVar81;
              uVar85 = (ushort)((short)uVar85 < sStack_82e) * sStack_82e |
                       ((short)uVar85 >= sStack_82e) * uVar85;
              uVar88 = (ushort)((short)uVar88 < sStack_82c) * sStack_82c |
                       ((short)uVar88 >= sStack_82c) * uVar88;
              uVar91 = (ushort)((short)uVar91 < sStack_82a) * sStack_82a |
                       ((short)uVar91 >= sStack_82a) * uVar91;
              local_858 = auVar96._0_2_;
              sStack_856 = auVar96._2_2_;
              sStack_854 = auVar96._4_2_;
              sStack_852 = auVar96._6_2_;
              sStack_850 = auVar96._8_2_;
              sStack_84e = auVar96._10_2_;
              sStack_84c = auVar96._12_2_;
              sStack_84a = auVar96._14_2_;
              vMaxH[1]._0_4_ =
                   CONCAT22((ushort)((short)uVar72 < sStack_856) * sStack_856 |
                            ((short)uVar72 >= sStack_856) * uVar72,
                            (ushort)((short)uVar67 < local_858) * local_858 |
                            ((short)uVar67 >= local_858) * uVar67);
              vMaxH[1]._0_6_ =
                   CONCAT24((ushort)((short)uVar75 < sStack_854) * sStack_854 |
                            ((short)uVar75 >= sStack_854) * uVar75,(undefined4)vMaxH[1]);
              vMaxH[1] = CONCAT26((ushort)((short)uVar78 < sStack_852) * sStack_852 |
                                  ((short)uVar78 >= sStack_852) * uVar78,(undefined6)vMaxH[1]);
              vSaturationCheckMax[0]._0_4_ =
                   CONCAT22((ushort)((short)uVar85 < sStack_84e) * sStack_84e |
                            ((short)uVar85 >= sStack_84e) * uVar85,
                            (ushort)((short)uVar81 < sStack_850) * sStack_850 |
                            ((short)uVar81 >= sStack_850) * uVar81);
              vSaturationCheckMax[0]._0_6_ =
                   CONCAT24((ushort)((short)uVar88 < sStack_84c) * sStack_84c |
                            ((short)uVar88 >= sStack_84c) * uVar88,
                            (undefined4)vSaturationCheckMax[0]);
              vSaturationCheckMax[0] =
                   CONCAT26((ushort)((short)uVar91 < sStack_84a) * sStack_84a |
                            ((short)uVar91 >= sStack_84a) * uVar91,
                            (undefined6)vSaturationCheckMax[0]);
              auVar48._8_8_ = vH[0];
              auVar48._0_8_ = vH_dag[1];
              auVar47._8_8_ = uVar14;
              auVar47._0_8_ = uVar11;
              auVar71 = psubsw(auVar48,auVar47);
              auVar46._8_8_ = vF[0];
              auVar46._0_8_ = vF_ext[1];
              auVar45._8_8_ = uVar15;
              auVar45._0_8_ = uVar12;
              auVar98 = psubsw(auVar46,auVar45);
              vFM[1] = auVar98._0_8_;
              vF_ext[0] = auVar98._8_8_;
              local_148 = auVar98._0_2_;
              sStack_146 = auVar98._2_2_;
              sStack_144 = auVar98._4_2_;
              sStack_142 = auVar98._6_2_;
              sStack_140 = auVar98._8_2_;
              sStack_13e = auVar98._10_2_;
              sStack_13c = auVar98._12_2_;
              sStack_13a = auVar98._14_2_;
              local_158 = auVar71._0_2_;
              sStack_156 = auVar71._2_2_;
              sStack_154 = auVar71._4_2_;
              sStack_152 = auVar71._6_2_;
              sStack_150 = auVar71._8_2_;
              sStack_14e = auVar71._10_2_;
              sStack_14c = auVar71._12_2_;
              sStack_14a = auVar71._14_2_;
              uVar70 = CONCAT26(-(ushort)(sStack_14a < sStack_13a),
                                CONCAT24(-(ushort)(sStack_14c < sStack_13c),
                                         CONCAT22(-(ushort)(sStack_14e < sStack_13e),
                                                  -(ushort)(sStack_150 < sStack_140)))) |
                       CONCAT26(-(ushort)(sStack_13a == sStack_14a),
                                CONCAT24(-(ushort)(sStack_13c == sStack_14c),
                                         CONCAT22(-(ushort)(sStack_13e == sStack_14e),
                                                  -(ushort)(sStack_140 == sStack_150))));
              auVar56._8_8_ = uVar70;
              auVar56._0_8_ =
                   CONCAT26(-(ushort)(sStack_152 < sStack_142),
                            CONCAT24(-(ushort)(sStack_154 < sStack_144),
                                     CONCAT22(-(ushort)(sStack_156 < sStack_146),
                                              -(ushort)(local_158 < local_148)))) |
                   CONCAT26(-(ushort)(sStack_142 == sStack_152),
                            CONCAT24(-(ushort)(sStack_144 == sStack_154),
                                     CONCAT22(-(ushort)(sStack_146 == sStack_156),
                                              -(ushort)(local_148 == local_158))));
              if ((((((((((((((((auVar56 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar56 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar56 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar56 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar56 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar56 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar56 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar56 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (uVar70 >> 7 & 1) == 0) && (uVar70 >> 0xf & 1) == 0) &&
                      (uVar70 >> 0x17 & 1) == 0) && (uVar70 >> 0x1f & 1) == 0) &&
                    (uVar70 >> 0x27 & 1) == 0) && (uVar70 >> 0x2f & 1) == 0) &&
                  (uVar70 >> 0x37 & 1) == 0) && -1 < (long)uVar70) goto LAB_00945074;
              vF_ext[1] = vFM[1];
              vF[0] = vF_ext[0];
              cond_max[1] = CONCAT26(-(ushort)(sStack_142 < sStack_152),
                                     CONCAT24(-(ushort)(sStack_144 < sStack_154),
                                              CONCAT22(-(ushort)(sStack_146 < sStack_156),
                                                       -(ushort)(local_148 < local_158))));
              cond[0] = CONCAT26(-(ushort)(sStack_13a < sStack_14a),
                                 CONCAT24(-(ushort)(sStack_13c < sStack_14c),
                                          CONCAT22(-(ushort)(sStack_13e < sStack_14e),
                                                   -(ushort)(sStack_140 < sStack_150))));
              auVar30._8_8_ = cond[0];
              auVar30._0_8_ = cond_max[1];
              register0x00001240 = pblendvb(stack0xffffffffffffef38,auVar97,auVar30);
              auVar29._8_8_ = cond[0];
              auVar29._0_8_ = cond_max[1];
              register0x00001240 = pblendvb(stack0xffffffffffffef28,auVar99,auVar29);
              auVar23._8_8_ = 0x1000100010001;
              auVar23._0_8_ = 0x1000100010001;
              auVar98 = paddsw(stack0xffffffffffffef18,auVar23);
              auVar22._8_8_ = 0x1000100010001;
              auVar22._0_8_ = 0x1000100010001;
              auVar71 = paddsw(auVar96,auVar22);
              auVar28._8_8_ = cond[0];
              auVar28._0_8_ = cond_max[1];
              register0x00001240 = pblendvb(auVar98,auVar71,auVar28);
              _tmp_6 = pvHLoad[k];
            }
          }
LAB_00945074:
          palVar63 = pvHMStore + iVar66;
          lVar19 = (*palVar63)[0];
          lVar20 = (*palVar63)[1];
          local_188 = (short)lVar19;
          sStack_186 = (short)((ulong)lVar19 >> 0x10);
          sStack_184 = (short)((ulong)lVar19 >> 0x20);
          sStack_182 = (short)((ulong)lVar19 >> 0x30);
          sStack_180 = (short)lVar20;
          sStack_17e = (short)((ulong)lVar20 >> 0x10);
          sStack_17c = (short)((ulong)lVar20 >> 0x20);
          sStack_17a = (short)((ulong)lVar20 >> 0x30);
          local_198 = (short)vMaxHM[1];
          sStack_196 = vMaxHM[1]._2_2_;
          sStack_194 = vMaxHM[1]._4_2_;
          sStack_192 = vMaxHM[1]._6_2_;
          sStack_190 = (short)vMaxHM[2];
          sStack_18e = vMaxHM[2]._2_2_;
          sStack_18c = vMaxHM[2]._4_2_;
          sStack_18a = vMaxHM[2]._6_2_;
          sVar68 = -(ushort)(local_198 < local_188);
          sVar69 = -(ushort)(sStack_196 < sStack_186);
          sVar73 = -(ushort)(sStack_194 < sStack_184);
          sVar74 = -(ushort)(sStack_192 < sStack_182);
          sVar76 = -(ushort)(sStack_190 < sStack_180);
          sVar77 = -(ushort)(sStack_18e < sStack_17e);
          sVar79 = -(ushort)(sStack_18c < sStack_17c);
          sVar80 = -(ushort)(sStack_18a < sStack_17a);
          auVar27._2_2_ = sVar69;
          auVar27._0_2_ = sVar68;
          auVar27._4_2_ = sVar73;
          auVar27._6_2_ = sVar74;
          auVar27._10_2_ = sVar77;
          auVar27._8_2_ = sVar76;
          auVar27._12_2_ = sVar79;
          auVar27._14_2_ = sVar80;
          register0x00001240 = pblendvb(stack0xfffffffffffff048,(undefined1  [16])*palVar63,auVar27)
          ;
          auVar26._2_2_ = sVar69;
          auVar26._0_2_ = sVar68;
          auVar26._4_2_ = sVar73;
          auVar26._6_2_ = sVar74;
          auVar26._10_2_ = sVar77;
          auVar26._8_2_ = sVar76;
          auVar26._12_2_ = sVar79;
          auVar26._14_2_ = sVar80;
          register0x00001240 =
               pblendvb(stack0xfffffffffffff038,(undefined1  [16])pvHSStore[iVar66],auVar26);
          auVar25._2_2_ = sVar69;
          auVar25._0_2_ = sVar68;
          auVar25._4_2_ = sVar73;
          auVar25._6_2_ = sVar74;
          auVar25._10_2_ = sVar77;
          auVar25._8_2_ = sVar76;
          auVar25._12_2_ = sVar79;
          auVar25._14_2_ = sVar80;
          register0x00001240 =
               pblendvb(stack0xfffffffffffff028,(undefined1  [16])pvHLStore[iVar66],auVar25);
          auVar24._2_2_ = sVar69;
          auVar24._0_2_ = sVar68;
          auVar24._4_2_ = sVar73;
          auVar24._6_2_ = sVar74;
          auVar24._10_2_ = sVar77;
          auVar24._8_2_ = sVar76;
          auVar24._12_2_ = sVar79;
          auVar24._14_2_ = sVar80;
          register0x00001240 =
               pblendvb(stack0xfffffffffffff018,(undefined1  [16])pvE[iVar66],auVar24);
          uVar70 = CONCAT26(result._6_2_,CONCAT24(result._4_2_,CONCAT22(result._2_2_,(short)result))
                           );
          auVar21._8_2_ = (short)vPosMask[0];
          auVar21._0_8_ = uVar70;
          auVar21._10_2_ = vPosMask[0]._2_2_;
          auVar21._12_2_ = vPosMask[0]._4_2_;
          auVar21._14_2_ = vPosMask[0]._6_2_;
          uStack_50 = auVar21._8_8_;
          uStack_50 = uStack_50 & CONCAT26(sVar80,CONCAT24(sVar79,CONCAT22(sVar77,sVar76)));
          auVar55._8_8_ = uStack_50;
          auVar55._0_8_ = uVar70 & CONCAT26(sVar74,CONCAT24(sVar73,CONCAT22(sVar69,sVar68)));
          if ((((((((((((((((auVar55 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar55 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar55 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar55 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar55 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar55 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (uStack_50 >> 7 & 1) != 0) || (uStack_50 >> 0xf & 1) != 0) ||
                  (uStack_50 >> 0x17 & 1) != 0) || (uStack_50 >> 0x1f & 1) != 0) ||
                (uStack_50 >> 0x27 & 1) != 0) || (uStack_50 >> 0x2f & 1) != 0) ||
              (uStack_50 >> 0x37 & 1) != 0) || (long)uStack_50 < 0) {
            matrix._0_4_ = s1Len;
          }
          pvE = pvHLLoad;
          pvHLLoad = palVar10;
          pvHLStore = pvHSLoad;
          pvHSLoad = palVar9;
          pvHSStore = pvHMLoad;
          pvHMLoad = palVar8;
          pvHMStore = pvHLoad;
          pvHLoad = palVar7;
        }
        local_f5a = sVar58;
        if (s2_end != 0) {
          for (end_query = 0; end_query < iVar61; end_query = end_query + 1) {
            vMaxH[0] = vMaxH[0] << 0x10 | (ulong)vMaxHM[1] >> 0x30;
            vMaxHM[1] = vMaxHM[1] << 0x10;
            vMaxHM[0] = vMaxHM[0] << 0x10 | (ulong)vMaxHS[1] >> 0x30;
            vMaxHS[1] = vMaxHS[1] << 0x10;
            vMaxHS[0] = vMaxHS[0] << 0x10 | (ulong)vMaxHL[1] >> 0x30;
            vMaxHL[1] = vMaxHL[1] << 0x10;
            vMaxHL[0] = vMaxHL[0] << 0x10 | (ulong)vPosMask[1] >> 0x30;
            vPosMask[1] = vPosMask[1] << 0x10;
          }
          local_f5a = vMaxH[0]._6_2_;
          local_f5c = vMaxHM[0]._6_2_;
          local_f5e = vMaxHS[0]._6_2_;
          local_f60 = vMaxHL[0]._6_2_;
        }
        matrix._4_4_ = iVar1 + -1;
        if (s1_end != 0) {
          m = (int16_t *)pvHLoad;
          s = (int16_t *)pvHMLoad;
          l = (int16_t *)pvHSLoad;
          _temp = pvHLLoad;
          for (k = 0; k < iVar60 * 8; k = k + 1) {
            iVar62 = k / 8 + (k % 8) * iVar60;
            if (iVar62 < iVar1) {
              if (local_f5a < *m) {
                local_f5a = *m;
                matrix._0_4_ = s2Len + -1;
                local_f5c = *s;
                local_f5e = *l;
                local_f60 = (short)(*_temp)[0];
                matrix._4_4_ = iVar62;
              }
              else if (((*m == local_f5a) && ((int)matrix == s2Len + -1)) && (iVar62 < matrix._4_4_)
                      ) {
                local_f5c = *s;
                local_f5e = *l;
                local_f60 = (short)(*_temp)[0];
                matrix._4_4_ = iVar62;
              }
            }
            m = m + 1;
            s = s + 1;
            l = l + 1;
            _temp = (__m128i *)((long)*_temp + 2);
          }
        }
        if ((s1_end == 0) && (s2_end == 0)) {
          vH_1[0] = pvHLoad[iVar66][1];
          vHM_1[0] = pvHMLoad[iVar66][1];
          vHS_1[0] = pvHSLoad[iVar66][1];
          vHL_1[0] = pvHLLoad[iVar66][1];
          uStack_1268 = pvHLLoad[iVar66][0];
          vHL_1[1] = pvHSLoad[iVar66][0];
          vHS_1[1] = pvHMLoad[iVar66][0];
          vHM_1[1] = pvHLoad[iVar66][0];
          for (end_query = 0; end_query < iVar61; end_query = end_query + 1) {
            vH_1[0] = vH_1[0] << 0x10 | (ulong)vHM_1[1] >> 0x30;
            vHM_1[0] = vHM_1[0] << 0x10 | (ulong)vHS_1[1] >> 0x30;
            vHS_1[0] = vHS_1[0] << 0x10 | (ulong)vHL_1[1] >> 0x30;
            vHL_1[0] = vHL_1[0] << 0x10 | uStack_1268 >> 0x30;
            uStack_1268 = uStack_1268 << 0x10;
            vHL_1[1] = vHL_1[1] << 0x10;
            vHS_1[1] = vHS_1[1] << 0x10;
            vHM_1[1] = vHM_1[1] << 0x10;
          }
          matrix._0_4_ = s2Len + -1;
          matrix._4_4_ = iVar1 + -1;
          local_f5a = vH_1[0]._6_2_;
          local_f5c = vHM_1[0]._6_2_;
          local_f5e = vHS_1[0]._6_2_;
          local_f60 = vHL_1[0]._6_2_;
        }
        local_28 = (short)vSaturationCheckMax[1];
        sStack_26 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
        sStack_24 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
        sStack_22 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
        sStack_20 = (short)vSaturationCheckMin[0];
        sStack_1e = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
        sStack_1c = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
        sStack_1a = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
        local_1a8 = (short)vMaxH[1];
        sStack_1a6 = (short)((ulong)vMaxH[1] >> 0x10);
        sStack_1a4 = (short)((ulong)vMaxH[1] >> 0x20);
        sStack_1a2 = (short)((ulong)vMaxH[1] >> 0x30);
        sStack_1a0 = (short)vSaturationCheckMax[0];
        sStack_19e = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
        sStack_19c = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
        sStack_19a = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
        uVar70 = CONCAT26(-(ushort)(sStack_1a < sVar58),
                          CONCAT24(-(ushort)(sStack_1c < sVar58),
                                   CONCAT22(-(ushort)(sStack_1e < sVar58),
                                            -(ushort)(sStack_20 < sVar58)))) |
                 CONCAT26(-(ushort)(sVar59 < sStack_19a),
                          CONCAT24(-(ushort)(sVar59 < sStack_19c),
                                   CONCAT22(-(ushort)(sVar59 < sStack_19e),
                                            -(ushort)(sVar59 < sStack_1a0))));
        auVar54._8_8_ = uVar70;
        auVar54._0_8_ =
             CONCAT26(-(ushort)(sStack_22 < sVar58),
                      CONCAT24(-(ushort)(sStack_24 < sVar58),
                               CONCAT22(-(ushort)(sStack_26 < sVar58),-(ushort)(local_28 < sVar58)))
                     ) |
             CONCAT26(-(ushort)(sVar59 < sStack_1a2),
                      CONCAT24(-(ushort)(sVar59 < sStack_1a4),
                               CONCAT22(-(ushort)(sVar59 < sStack_1a6),-(ushort)(sVar59 < local_1a8)
                                       )));
        if ((((((((((((((((auVar54 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar54 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar54 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar54 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar54 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar54 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar70 >> 7 & 1) != 0) || (uVar70 >> 0xf & 1) != 0) || (uVar70 >> 0x17 & 1) != 0)
               || (uVar70 >> 0x1f & 1) != 0) || (uVar70 >> 0x27 & 1) != 0) ||
             (uVar70 >> 0x2f & 1) != 0) || (uVar70 >> 0x37 & 1) != 0) || (long)uVar70 < 0) {
          *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x40;
          local_f5a = 0;
          local_f5c = 0;
          local_f5e = 0;
          local_f60 = 0;
          matrix._4_4_ = 0;
          matrix._0_4_ = 0;
        }
        *(int *)&_segNum->s1 = (int)local_f5a;
        *(int *)((long)&_segNum->s1 + 4) = matrix._4_4_;
        _segNum->s1Len = (int)matrix;
        *(int *)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->extra =
             (int)local_f5c;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->stats->similar =
             (int)local_f5e;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->stats->length =
             (int)local_f60;
        parasail_free(ptr_00);
        parasail_free(b_01);
        parasail_free(b_00);
        parasail_free(b);
        parasail_free(ptr);
        parasail_free(pvE);
        parasail_free(pvHLLoad);
        parasail_free(pvHLStore);
        parasail_free(pvHSLoad);
        parasail_free(pvHSStore);
        parasail_free(pvHMLoad);
        parasail_free(pvHMStore);
        parasail_free(pvHLoad);
        profile_local = _segNum;
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHM;
    __m128i vMaxHS;
    __m128i vMaxHL;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile16.score;
    vProfileM = (__m128i*)profile->profile16.matches;
    vProfileS = (__m128i*)profile->profile16.similar;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHM = vNegLimit;
    vMaxHS = vNegLimit;
    vMaxHL = vNegLimit;
    vPosMask = _mm_cmpeq_epi16(_mm_set1_epi16(position),
            _mm_set_epi16(0,1,2,3,4,5,6,7));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop. */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 2);
        vHM = _mm_slli_si128(vHM, 2);
        vHS = _mm_slli_si128(vHS, 2);
        vHL = _mm_slli_si128(vHL, 2);

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi16(vH_dag, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi16(vH, vH_dag);
            case2 = _mm_cmpeq_epi16(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_adds_epi16(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_adds_epi16(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_adds_epi16(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_subs_epi16(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi16(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_adds_epi16(vEL, vOne),
                    _mm_adds_epi16(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_adds_epi16(vFL, vOne),
                    _mm_adds_epi16(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 2);
            vF = _mm_slli_si128(vF, 2);
            vFM = _mm_slli_si128(vFM, 2);
            vFS = _mm_slli_si128(vFS, 2);
            vFL = _mm_slli_si128(vFL, 2);
            vHp = _mm_insert_epi16(vHp, boundary[j], 0);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            vFL = _mm_insert_epi16(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_adds_epi16(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi16(vH, vHp);
                case2 = _mm_cmpeq_epi16(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_subs_epi16(vH, vGapO);
                vF_ext = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi16(vF_ext, vEF_opn),
                                _mm_cmpeq_epi16(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi16(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi16(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_adds_epi16(vFL, vOne),
                        _mm_adds_epi16(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

        /* extract vector containing last value from the column */
        {
            __m128i cond_max;
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            cond_max = _mm_cmpgt_epi16(vH, vMaxH);
            vMaxH = _mm_blendv_epi8(vMaxH, vH, cond_max);
            vMaxHM = _mm_blendv_epi8(vMaxHM, vHM, cond_max);
            vMaxHS = _mm_blendv_epi8(vMaxHS, vHS, cond_max);
            vMaxHL = _mm_blendv_epi8(vMaxHL, vHL, cond_max);
            if (_mm_movemask_epi8(_mm_and_si128(vPosMask, cond_max))) {
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 2);
            vHM = _mm_slli_si128(vHM, 2);
            vHS = _mm_slli_si128(vHS, 2);
            vHL = _mm_slli_si128(vHL, 2);
        }
        result->stats->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        result->stats->rowcols->matches_row[j] = (int16_t) _mm_extract_epi16 (vHM, 7);
        result->stats->rowcols->similar_row[j] = (int16_t) _mm_extract_epi16 (vHS, 7);
        result->stats->rowcols->length_row[j] = (int16_t) _mm_extract_epi16 (vHL, 7);
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the column maximums */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 2);
            vMaxHM = _mm_slli_si128(vMaxHM, 2);
            vMaxHS = _mm_slli_si128(vMaxHS, 2);
            vMaxHL = _mm_slli_si128(vMaxHL, 2);
        }
        end_query = s1Len-1;
        score = (int16_t) _mm_extract_epi16(vMaxH, 7);
        matches = (int16_t) _mm_extract_epi16(vMaxHM, 7);
        similar = (int16_t) _mm_extract_epi16(vMaxHS, 7);
        length = (int16_t) _mm_extract_epi16(vMaxHL, 7);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int16_t *t = (int16_t*)pvHStore;
        int16_t *m = (int16_t*)pvHMStore;
        int16_t *s = (int16_t*)pvHSStore;
        int16_t *l = (int16_t*)pvHLStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 2);
            vHM = _mm_slli_si128(vHM, 2);
            vHS = _mm_slli_si128(vHS, 2);
            vHL = _mm_slli_si128(vHL, 2);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int16_t) _mm_extract_epi16 (vH, 7);
        matches = (int16_t) _mm_extract_epi16 (vHM, 7);
        similar = (int16_t) _mm_extract_epi16 (vHS, 7);
        length = (int16_t) _mm_extract_epi16 (vHL, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}